

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::SingleThreadedStrategy::IncrementAndGet
          (SingleThreadedStrategy *this,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          size_t delta)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = delta + this->last_claimed_sequence_;
  this->last_claimed_sequence_ = lVar2;
  lVar3 = lVar2 - this->buffer_size_;
  if (this->last_consumer_sequence_ < lVar3) {
    while (iVar1 = GetMinimumSequence(dependents,0x7fffffffffffffff), iVar1 < lVar3) {
      sched_yield();
    }
  }
  return lVar2;
}

Assistant:

int64_t IncrementAndGet(Sequence& cursor,
                          const std::vector<Sequence*>& dependents,
                          size_t delta = 1) {
    const int64_t next_sequence = (last_claimed_sequence_ += delta);
    const int64_t wrap_point = next_sequence - buffer_size_;
    if (last_consumer_sequence_ < wrap_point) {
      while (GetMinimumSequence(dependents) < wrap_point) {
        // TODO: configurable yield strategy
        std::this_thread::yield();
      }
    }
    return next_sequence;
  }